

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O1

char * __thiscall
google::protobuf::strings::GrowingArrayByteSink::GetBuffer
          (GrowingArrayByteSink *this,size_t *nbytes)

{
  char *pcVar1;
  
  ShrinkToFit(this);
  pcVar1 = this->buf_;
  *nbytes = this->size_;
  this->capacity_ = 0;
  this->buf_ = (char *)0x0;
  this->size_ = 0;
  return pcVar1;
}

Assistant:

char* GrowingArrayByteSink::GetBuffer(size_t* nbytes) {
  ShrinkToFit();
  char* b = buf_;
  *nbytes = size_;
  buf_ = nullptr;
  size_ = capacity_ = 0;
  return b;
}